

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

vector<nonius::parameters,_std::allocator<nonius::parameters>_> *
nonius::generate_params
          (vector<nonius::parameters,_std::allocator<nonius::parameters>_> *__return_storage_ptr__,
          param_configuration *cfg)

{
  anon_class_40_5_c0cd6f44 __gen;
  iterator iVar1;
  undefined8 uVar2;
  long lVar3;
  initializer_list<nonius::parameters> __l;
  param step;
  __alloc_node_gen_t __alloc_node_gen;
  mapped_type oper;
  __alloc_node_gen_t __alloc_node_gen_1;
  parameters params;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined8 local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1a0;
  code *local_168;
  long *local_160 [2];
  long local_150 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  code *local_130 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_120;
  _Any_data *p_Stack_118;
  undefined8 *local_110;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Stack_108;
  optional<nonius::run_configuration> *local_100;
  _Any_data local_f8;
  code *local_e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (global_param_registry()::instance == '\0') {
    generate_params();
  }
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count =
       (cfg->map).
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count =
       (cfg->map).
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_element_count;
  local_68._M_rehash_policy._M_max_load_factor =
       (cfg->map).
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ =
       *(undefined4 *)
        &(cfg->map).
         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
         ._M_h._M_rehash_policy.field_0x4;
  local_68._M_rehash_policy._M_next_resize =
       (cfg->map).
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_rehash_policy._M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_1a0._M_buckets = (__buckets_ptr)&local_68;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,nonius::param>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_68,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)cfg,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>_>_>
                     *)&local_1a0);
  parameters::merged((parameters *)&local_a0,(parameters *)global_param_registry()::instance,
                     (parameters *)&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if ((cfg->run).initialized == false) {
    local_1a0._M_buckets = (__buckets_ptr)0x0;
    local_1a0._M_bucket_count = local_a0._M_bucket_count;
    local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1a0._M_element_count = local_a0._M_element_count;
    local_1a0._M_rehash_policy._M_max_load_factor = local_a0._M_rehash_policy._M_max_load_factor;
    local_1a0._M_rehash_policy._4_4_ = local_a0._M_rehash_policy._4_4_;
    local_1a0._M_rehash_policy._M_next_resize = local_a0._M_rehash_policy._M_next_resize;
    local_1a0._M_single_bucket = (__node_base_ptr)0x0;
    local_d8._M_buckets = (__buckets_ptr)&local_1a0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,nonius::param>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_1a0,&local_a0,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>_>_>
                *)&local_d8);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_1a0;
    std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&local_d8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_1a0);
  }
  else {
    local_1b0 = *(undefined8 *)((long)&(cfg->run).storage + 0x50);
    local_1a8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&(cfg->run).storage + 0x58)
    ;
    if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_1a8->_M_use_count = local_1a8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_1a8->_M_use_count = local_1a8->_M_use_count + 1;
      }
    }
    local_1a0._M_buckets = &local_1a0._M_before_begin._M_nxt;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"+","");
    local_1a0._M_rehash_policy._M_max_load_factor = 0.0;
    local_1a0._M_rehash_policy._4_4_ = 0;
    local_1a0._M_rehash_policy._M_next_resize = 0;
    local_168 = std::
                _Function_handler<nonius::param_(nonius::param,_nonius::param),_std::plus<nonius::param>_>
                ::_M_invoke;
    local_1a0._M_single_bucket =
         (__node_base_ptr)
         std::
         _Function_handler<nonius::param_(nonius::param,_nonius::param),_std::plus<nonius::param>_>
         ::_M_manager;
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"*","");
    local_140 = 0;
    uStack_138 = 0;
    local_130[1] = std::
                   _Function_handler<nonius::param_(nonius::param,_nonius::param),_std::multiplies<nonius::param>_>
                   ::_M_invoke;
    local_130[0] = std::
                   _Function_handler<nonius::param_(nonius::param,_nonius::param),_std::multiplies<nonius::param>_>
                   ::_M_manager;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<nonius::param(nonius::param,nonius::param)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<nonius::param(nonius::param,nonius::param)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _Hashtable<std::pair<std::__cxx11::string_const,std::function<nonius::param(nonius::param,nonius::param)>>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<nonius::param(nonius::param,nonius::param)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<nonius::param(nonius::param,nonius::param)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,&local_1a0,local_130 + 2,0,&local_1b1,&local_1b2,&local_1b3);
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_d8,(key_type *)((long)&(cfg->run).storage + 0x20));
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar2 = std::__throw_out_of_range("_Map_base::at");
      __clang_call_terminate(uVar2);
    }
    std::function<nonius::param_(nonius::param,_nonius::param)>::function
              ((function<nonius::param_(nonius::param,_nonius::param)> *)&local_f8,
               (function<nonius::param_(nonius::param,_nonius::param)> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>,_true>
                      ._M_cur + 0x28));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<nonius::param_(nonius::param,_nonius::param)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d8);
    lVar3 = 0;
    do {
      if (*(code **)((long)local_130 + lVar3) != (code *)0x0) {
        (**(code **)((long)local_130 + lVar3))((long)&local_140 + lVar3,(long)&local_140 + lVar3,3);
      }
      if ((void *)((long)local_150 + lVar3) != *(void **)((long)local_160 + lVar3)) {
        operator_delete(*(void **)((long)local_160 + lVar3),*(long *)((long)local_150 + lVar3) + 1);
      }
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != -0x80);
    (__return_storage_ptr__->
    super__Vector_base<nonius::parameters,_std::allocator<nonius::parameters>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<nonius::parameters,_std::allocator<nonius::parameters>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<nonius::parameters,_std::allocator<nonius::parameters>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a0._M_buckets = *(__buckets_ptr *)((long)&(cfg->run).storage + 0x40);
    local_1a0._M_bucket_count = *(long *)((long)&(cfg->run).storage + 0x48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count)->
             _M_use_count + 1;
      }
    }
    lVar3 = *(long *)((long)&(cfg->run).storage + 0x60);
    local_120 = &local_1a0;
    p_Stack_118 = &local_f8;
    local_110 = &local_1b0;
    p_Stack_108 = &local_a0;
    __gen.oper = (mapped_type *)p_Stack_118;
    __gen.next = (param *)local_120;
    __gen.step = (param *)local_110;
    __gen.params = (parameters *)p_Stack_108;
    __gen.run = (run_configuration *)&cfg->run;
    local_100 = &cfg->run;
    std::
    generate_n<std::back_insert_iterator<std::vector<nonius::parameters,std::allocator<nonius::parameters>>>,unsigned_long,nonius::generate_params(nonius::param_configuration)::_lambda()_1_>
              ((back_insert_iterator<std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
                )__return_storage_ptr__,lVar3 + (ulong)(lVar3 == 0),__gen);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_bucket_count);
    }
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<parameters> generate_params(param_configuration cfg) {
        auto params = global_param_registry().defaults().merged(cfg.map);
        if (!cfg.run) {
            return {params};
        } else {
            using operation_t = std::function<param(param, param)>;

            auto&& run = *cfg.run;
            auto step = run.step;
            auto oper = std::unordered_map<std::string, operation_t> {
                {"+", std::plus<param>{}},
                {"*", std::multiplies<param>{}},
            }.at(run.op);

            auto r = std::vector<parameters>{};
            auto next = run.init;
            std::generate_n(std::back_inserter(r), std::max(run.count, std::size_t{1}), [&] {
                auto last = next;
                next = oper(next, step);
                return params.merged(parameters{{run.name, last}});
            });

            return r;
        }
    }